

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUleft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *p_work,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *vec)

{
  int iVar1;
  int iVar2;
  int iVar3;
  type_conflict5 tVar4;
  long in_RDX;
  cpp_dec_float<50U,_int,_void> *in_RDI;
  int m;
  int end;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int r;
  int c;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffec8;
  undefined1 local_128 [16];
  self_type *in_stack_fffffffffffffee8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffef0;
  int local_f0;
  undefined8 local_e0 [6];
  double in_stack_ffffffffffffff50;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffff58;
  int local_94;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_51;
  reference local_50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  reference local_30;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  long local_10;
  undefined8 *local_8;
  
  for (local_94 = 0; local_94 < (int)(in_RDI->data)._M_elems[1]; local_94 = local_94 + 1) {
    iVar1 = *(int *)(*(long *)(in_RDI[5].data._M_elems + 8) + (long)local_94 * 4);
    iVar2 = *(int *)(*(long *)(in_RDI[5].data._M_elems + 4) + (long)local_94 * 4);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_RDI,in_stack_fffffffffffffec8);
    local_e0[0] = 0;
    local_10 = in_RDX + (long)iVar1 * 0x38;
    local_18 = local_e0;
    local_8 = local_18;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    tVar4 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffec8,(double *)0x36896a);
    if (tVar4) {
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    *)(in_RDI[8].data._M_elems + 4),(long)iVar2);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
      ::operator*=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_RDI,in_stack_fffffffffffffec8);
      iVar1 = *(int *)(*(long *)in_RDI[10].data._M_elems + (long)iVar2 * 4);
      iVar3 = *(int *)(*(long *)(in_RDI[10].data._M_elems + 2) + (long)iVar2 * 4);
      for (local_f0 = *(int *)(*(long *)in_RDI[10].data._M_elems + (long)iVar2 * 4);
          local_f0 < iVar1 + iVar3; local_f0 = local_f0 + 1) {
        local_50 = std::
                   vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *)(in_RDI[9].data._M_elems + 6),(long)local_f0);
        local_40 = local_128;
        local_48 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)local_e0 + 0xc);
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_51,local_48,local_50);
        local_38 = local_128;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDI);
        local_20 = local_128;
        local_28 = local_48;
        local_30 = local_50;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (in_RDI,in_stack_fffffffffffffec8,(cpp_dec_float<50U,_int,_void> *)0x368ae8);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator-=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUleft(R* p_work, R* vec)
{
   for(int i = 0; i < thedim; ++i)
   {
      int  c  = col.orig[i];
      int  r  = row.orig[i];

      assert(c >= 0);    // Inna/Tobi: otherwise, vec[c] would be strange...
      assert(r >= 0);    // Inna/Tobi: otherwise, diag[r] would be strange...

      R x  = vec[c];


      vec[c]  = 0.0;

      if(x != 0.0)
      {
         SOPLEX_DEBUG_CHECK_HUGE_VALUE("WSOLVE01", x);
         SOPLEX_DEBUG_CHECK_HUGE_VALUE("WSOLVE02", diag[r]);

         x        *= diag[r];
         p_work[r] = x;

         int end = u.row.start[r] + u.row.len[r];

         for(int m = u.row.start[r]; m < end; m++)
         {
            vec[u.row.idx[m]] -= x * u.row.val[m];
            SOPLEX_DEBUG_CHECK_HUGE_VALUE("WSOLVE03", vec[u.row.idx[m]]);
         }
      }
   }
}